

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

int ClipperLib::PointInPolygon(IntPoint *pt,OutPt *op)

{
  long lVar1;
  long lVar2;
  OutPt *pOVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  OutPt *pOVar11;
  long lVar12;
  double dVar13;
  
  lVar1 = pt->X;
  lVar2 = pt->Y;
  iVar10 = 0;
  iVar7 = 0;
  pOVar11 = op;
  do {
    pOVar3 = pOVar11->Next;
    lVar4 = (pOVar3->Pt).Y;
    if (lVar4 - lVar2 == 0) {
      lVar5 = (pOVar3->Pt).X;
      if (lVar5 == lVar1) {
        return -1;
      }
      lVar12 = (pOVar11->Pt).Y;
      if (lVar12 != lVar2) goto LAB_0028e78f;
      if (lVar1 <= (pOVar11->Pt).X != lVar1 < lVar5) {
        return -1;
      }
      lVar12 = lVar2;
      if (lVar4 < lVar2) goto LAB_0028e7a1;
    }
    else {
      lVar12 = (pOVar11->Pt).Y;
LAB_0028e78f:
      if (lVar2 <= lVar4 == lVar12 < lVar2) {
LAB_0028e7a1:
        lVar5 = (pOVar11->Pt).X;
        lVar6 = (pOVar3->Pt).X;
        if (lVar5 < lVar1) {
          lVar9 = lVar6 - lVar1;
          if (lVar9 != 0 && lVar1 <= lVar6) {
LAB_0028e7c5:
            dVar13 = (double)(lVar4 - lVar2) * (double)(lVar5 - lVar1) -
                     (double)(lVar12 - lVar2) * (double)lVar9;
            if ((dVar13 == 0.0) && (!NAN(dVar13))) {
              return -1;
            }
            iVar8 = 1 - iVar7;
            iVar7 = iVar10;
            if (lVar4 <= lVar12 != 0.0 < dVar13) {
              iVar7 = iVar8;
              iVar10 = iVar8;
            }
          }
        }
        else {
          lVar9 = lVar6 - lVar1;
          if (lVar9 == 0 || lVar6 < lVar1) goto LAB_0028e7c5;
          iVar7 = 1 - iVar7;
          iVar10 = iVar7;
        }
      }
    }
    pOVar11 = pOVar3;
    if (pOVar3 == op) {
      return iVar7;
    }
  } while( true );
}

Assistant:

int PointInPolygon (const IntPoint &pt, OutPt *op)
{
  //returns 0 if false, +1 if true, -1 if pt ON polygon boundary
  int result = 0;
  OutPt* startOp = op;
  for(;;)
  {
    if (op->Next->Pt.Y == pt.Y)
    {
        if ((op->Next->Pt.X == pt.X) || (op->Pt.Y == pt.Y && 
          ((op->Next->Pt.X > pt.X) == (op->Pt.X < pt.X)))) return -1;
    }
    if ((op->Pt.Y < pt.Y) != (op->Next->Pt.Y < pt.Y))
    {
      if (op->Pt.X >= pt.X)
      {
        if (op->Next->Pt.X > pt.X) result = 1 - result;
        else
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      } else
      {
        if (op->Next->Pt.X > pt.X)
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      }
    } 
    op = op->Next;
    if (startOp == op) break;
  } 
  return result;
}